

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMf.c
# Opt level: O0

void Mf_ManFree(Mf_Man_t *p)

{
  int iVar1;
  int iVar2;
  Mf_Man_t *p_local;
  
  if (p->pPars->fGenCnf != 0) {
    iVar1 = Vec_IntSize(&p->vCnfSizes);
    iVar2 = Vec_MemEntryNum(p->vTtMem);
    if (iVar1 != iVar2) {
      __assert_fail("!p->pPars->fGenCnf || Vec_IntSize(&p->vCnfSizes) == Vec_MemEntryNum(p->vTtMem)"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaMf.c"
                    ,0x54c,"void Mf_ManFree(Mf_Man_t *)");
    }
  }
  if (p->pPars->fCutMin != 0) {
    Vec_MemHashFree(p->vTtMem);
  }
  if (p->pPars->fCutMin != 0) {
    Vec_MemFree(p->vTtMem);
  }
  Vec_PtrFreeData(&p->vPages);
  if ((p->vCnfSizes).pArray != (int *)0x0) {
    free((p->vCnfSizes).pArray);
    (p->vCnfSizes).pArray = (int *)0x0;
  }
  if ((p->vCnfMem).pArray != (int *)0x0) {
    free((p->vCnfMem).pArray);
    (p->vCnfMem).pArray = (int *)0x0;
  }
  if ((p->vPages).pArray != (void **)0x0) {
    free((p->vPages).pArray);
    (p->vPages).pArray = (void **)0x0;
  }
  if (p->pLfObjs != (Mf_Obj_t *)0x0) {
    free(p->pLfObjs);
    p->pLfObjs = (Mf_Obj_t *)0x0;
  }
  if (p != (Mf_Man_t *)0x0) {
    free(p);
  }
  return;
}

Assistant:

void Mf_ManFree( Mf_Man_t * p )
{
    assert( !p->pPars->fGenCnf || Vec_IntSize(&p->vCnfSizes) == Vec_MemEntryNum(p->vTtMem) );
    if ( p->pPars->fCutMin )
        Vec_MemHashFree( p->vTtMem );
    if ( p->pPars->fCutMin )
        Vec_MemFree( p->vTtMem );
    Vec_PtrFreeData( &p->vPages );
    ABC_FREE( p->vCnfSizes.pArray );
    ABC_FREE( p->vCnfMem.pArray );
    ABC_FREE( p->vPages.pArray );
    ABC_FREE( p->pLfObjs );
    ABC_FREE( p );
}